

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O2

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CNumExp *exp)

{
  string sStack_38;
  
  PositionInfo::GetStringPosition_abi_cxx11_
            (&sStack_38,&(exp->super_IExpression).super_PositionedNode.position);
  std::__cxx11::string::append((string *)&this->code);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::to_string(&sStack_38,exp->number);
  std::__cxx11::string::append((string *)&this->code);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void CConvertVisitor::Visit(CNumExp &exp) {
	this->code += exp.position.GetStringPosition();
	this->code += std::to_string(exp.number);
}